

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSavable.h
# Opt level: O0

TPZSavable * __thiscall
TPZRestoreClass<TPZEquationFilter>::Restore(TPZRestoreClass<TPZEquationFilter> *this)

{
  TPZSavable *pTVar1;
  TPZEquationFilter *ptr;
  TPZEquationFilter *in_stack_fffffffffffffff0;
  
  pTVar1 = (TPZSavable *)operator_new(0x58);
  TPZEquationFilter::TPZEquationFilter(in_stack_fffffffffffffff0);
  return pTVar1;
}

Assistant:

virtual TPZSavable *Restore() override {
        T *ptr = new T;
        return ptr;
    }